

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void RemoveSingleNodeFromList(aiNode *nd)

{
  aiNode *paVar1;
  uint local_1c;
  uint i;
  aiNode *par;
  aiNode *nd_local;
  
  if (((nd != (aiNode *)0x0) && (nd->mNumChildren == 0)) && (nd->mParent != (aiNode *)0x0)) {
    paVar1 = nd->mParent;
    for (local_1c = 0; local_1c < paVar1->mNumChildren; local_1c = local_1c + 1) {
      if (paVar1->mChildren[local_1c] == nd) {
        paVar1->mNumChildren = paVar1->mNumChildren - 1;
        for (; local_1c < paVar1->mNumChildren; local_1c = local_1c + 1) {
          paVar1->mChildren[local_1c] = paVar1->mChildren[local_1c + 1];
        }
        if (nd == (aiNode *)0x0) {
          return;
        }
        aiNode::~aiNode(nd);
        operator_delete(nd);
        return;
      }
    }
  }
  return;
}

Assistant:

void RemoveSingleNodeFromList(aiNode* nd)
{
    if (!nd || nd->mNumChildren || !nd->mParent)return;
    aiNode* par = nd->mParent;
    for (unsigned int i = 0; i < par->mNumChildren;++i) {
        if (par->mChildren[i] == nd) {
            --par->mNumChildren;
            for (;i < par->mNumChildren;++i) {
                par->mChildren[i] = par->mChildren[i+1];
            }
            delete nd;
            break;
        }
    }
}